

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-connect.c
# Opt level: O2

void alloc_cb(uv_handle_t *handle,size_t suggested_size,uv_buf_t *buf)

{
  char *pcVar1;
  undefined8 uStack_10;
  
  if ((uv_udp_t *)handle == &client || (uv_udp_t *)handle == &server) {
    if (suggested_size < 0x10001) {
      buf->base = alloc_cb::slab;
      buf->len = 0x10000;
      return;
    }
    pcVar1 = "suggested_size <= sizeof(slab)";
    uStack_10 = 0x2d;
  }
  else {
    pcVar1 = "(uv_udp_t*)(handle) == &server || (uv_udp_t*)(handle) == &client";
    uStack_10 = 0x2c;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-try-send.c"
          ,uStack_10,pcVar1);
  abort();
}

Assistant:

static void alloc_cb(uv_handle_t* handle,
                     size_t suggested_size,
                     uv_buf_t* buf) {
  static char slab[65536];
  CHECK_HANDLE(handle);
  ASSERT(suggested_size <= sizeof(slab));
  buf->base = slab;
  buf->len = sizeof(slab);
}